

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib509.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar a [14];
  undefined6 uStack_28;
  undefined2 local_22;
  undefined6 uStack_20;
  
  uStack_20 = 0xf7e6d5c4b3a2;
  uStack_28 = 0x3e3d3c3b3a2f;
  local_22 = 0x913f;
  iVar1 = curl_global_init_mem
                    (3,custom_malloc,custom_free,custom_realloc,custom_strdup,custom_calloc);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 != 0) {
      lVar3 = 0;
      iVar1 = curl_easy_setopt(lVar2,0x2722,"test509");
      if (iVar1 == 0) {
        lVar3 = curl_easy_escape(lVar2,&uStack_28,0xe);
      }
      if (lVar3 != 0) {
        curl_free(lVar3);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init_mem() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                       0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res;
  CURL *curl;
  int asize;
  char *str = NULL;

  (void)URL;

  res = curl_global_init_mem(CURL_GLOBAL_ALL,
                             custom_malloc,
                             custom_free,
                             custom_realloc,
                             custom_strdup,
                             custom_calloc);
  if(res != CURLE_OK) {
    fprintf(stderr, "curl_global_init_mem() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_USERAGENT, "test509"); /* uses strdup() */

  asize = (int)sizeof(a);
  str = curl_easy_escape(curl, (char *)a, asize); /* uses realloc() */

test_cleanup:

  if(str)
    curl_free(str);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}